

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  sqlite3 *db;
  char *zName;
  VList *pVVar4;
  bool bVar5;
  long lVar6;
  int *piVar7;
  Expr *pEVar8;
  short sVar9;
  undefined1 *puVar10;
  int *piVar11;
  u32 uVar12;
  int iVar13;
  int *piVar14;
  long in_FS_OFFSET;
  bool bVar15;
  i64 i;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr == (Expr *)0x0) goto LAB_0016fef2;
  db = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = pParse->nVar;
    sVar9 = uVar1 + 1;
    pParse->nVar = sVar9;
  }
  else {
    if (*zName == '?') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      if (n == 2) {
        local_40 = (undefined1 *)((long)zName[1] + -0x30);
        bVar15 = false;
      }
      else {
        iVar13 = sqlite3Atoi64(zName + 1,(i64 *)&local_40,n - 1,'\x01');
        bVar15 = iVar13 != 0;
      }
      if (((long)local_40 < 1 || bVar15) || ((long)db->aLimit[9] < (long)local_40)) {
        sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d",
                        (ulong)(uint)db->aLimit[9]);
        pEVar8 = pExpr;
        do {
          if (((pEVar8->flags & 3) == 0) && (0 < (pEVar8->w).iJoin)) {
            if ((pEVar8->flags >> 0x1e & 1) == 0) {
              pParse->db->errByteOffset = (pEVar8->w).iJoin;
            }
            break;
          }
          pEVar8 = pEVar8->pLeft;
        } while (pEVar8 != (Expr *)0x0);
        bVar5 = false;
        bVar15 = false;
        puVar10 = (undefined1 *)0xaaaa;
      }
      else {
        sVar9 = (short)local_40;
        puVar10 = local_40;
        if (pParse->nVar < sVar9) {
          pParse->nVar = sVar9;
          bVar15 = true;
          bVar5 = true;
        }
        else {
          pVVar4 = pParse->pVList;
          bVar15 = true;
          bVar5 = true;
          if (pVVar4 != (VList *)0x0) {
            iVar13 = 2;
            do {
              piVar11 = pVVar4 + iVar13;
              if (*piVar11 == (int)sVar9) {
                bVar15 = piVar11 == (int *)0xfffffffffffffff8;
                break;
              }
              iVar13 = iVar13 + piVar11[1];
            } while (iVar13 < pVVar4[1]);
          }
        }
      }
      sVar9 = (short)puVar10;
      if (bVar5) goto LAB_0016fdc5;
      bVar5 = false;
    }
    else {
      iVar13 = sqlite3VListNameToNum(pParse->pVList,zName,n);
      sVar9 = (short)iVar13;
      bVar15 = false;
      if (sVar9 == 0) {
        uVar2 = pParse->nVar;
        sVar9 = uVar2 + 1;
        pParse->nVar = sVar9;
        bVar15 = true;
      }
LAB_0016fdc5:
      bVar5 = true;
      if (bVar15) {
        uVar12 = n + 3;
        if (-1 < (int)n) {
          uVar12 = n;
        }
        piVar11 = pParse->pVList;
        iVar13 = ((int)uVar12 >> 2) + 3;
        piVar14 = piVar11;
        if (piVar11 == (int *)0x0) {
          lVar6 = 10;
LAB_0016fe24:
          piVar7 = (int *)sqlite3DbRealloc(db,piVar11,(iVar13 + lVar6) * 4);
          if (piVar7 != (int *)0x0) {
            if (piVar11 == (int *)0x0) {
              piVar7[1] = 2;
            }
            *piVar7 = (int)(iVar13 + lVar6);
            piVar14 = piVar7;
          }
          if (piVar7 != (int *)0x0) goto LAB_0016fe63;
        }
        else {
          if (*piVar11 < piVar11[1] + iVar13) {
            lVar6 = (long)*piVar11 * 2;
            goto LAB_0016fe24;
          }
LAB_0016fe63:
          piVar11 = piVar14;
          iVar3 = piVar11[1];
          piVar14 = piVar11 + iVar3;
          *piVar14 = (int)sVar9;
          piVar14[1] = iVar13;
          piVar11[1] = iVar13 + iVar3;
          memcpy(piVar14 + 2,zName,(long)(int)n);
          *(undefined1 *)((long)piVar11 + (long)(int)n + 8U + (long)iVar3 * 4) = 0;
        }
        bVar5 = true;
        pParse->pVList = piVar11;
      }
    }
    if (!bVar5) goto LAB_0016fef2;
  }
  pExpr->iColumn = sVar9;
  if (db->aLimit[9] < (int)sVar9) {
    sqlite3ErrorMsg(pParse,"too many SQL variables");
    do {
      if (((pExpr->flags & 3) == 0) && (0 < (pExpr->w).iJoin)) {
        if ((pExpr->flags >> 0x1e & 1) == 0) {
          pParse->db->errByteOffset = (pExpr->w).iJoin;
        }
        break;
      }
      pExpr = pExpr->pLeft;
    } while (pExpr != (Expr *)0x0);
  }
LAB_0016fef2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
    sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
  }
}